

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet_decoder.c
# Opt level: O0

int pt_pkt_decode(pt_packet_decoder *decoder,pt_packet *packet)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  pt_config *ppVar4;
  byte *pbVar5;
  uint8_t ext2;
  uint8_t ext;
  uint8_t opc;
  uint8_t *end;
  uint8_t *begin;
  uint8_t *pos;
  pt_config *config;
  pt_packet *packet_local;
  pt_packet_decoder *decoder_local;
  
  ppVar4 = pt_pkt_config(decoder);
  if (ppVar4 == (pt_config *)0x0) {
    decoder_local._4_4_ = -1;
  }
  else {
    pbVar2 = ppVar4->begin;
    pbVar5 = pt_pkt_pos(decoder);
    if (pbVar5 < pbVar2) {
      decoder_local._4_4_ = -3;
    }
    else {
      pbVar2 = ppVar4->end;
      if (pbVar5 < pbVar2) {
        bVar1 = *pbVar5;
        if (bVar1 == 0) {
          decoder_local._4_4_ = pt_pkt_decode_pad(decoder,packet);
        }
        else if (bVar1 == 2) {
          if (pbVar5 + 1 < pbVar2) {
            bVar1 = pbVar5[1];
            if (bVar1 == 3) {
              decoder_local._4_4_ = pt_pkt_decode_cbr(decoder,packet);
            }
            else if (bVar1 == 0x13) {
              decoder_local._4_4_ = pt_pkt_decode_cfe(decoder,packet);
            }
            else if (bVar1 == 0x22) {
              decoder_local._4_4_ = pt_pkt_decode_pwre(decoder,packet);
            }
            else if (bVar1 == 0x23) {
              decoder_local._4_4_ = pt_pkt_decode_psbend(decoder,packet);
            }
            else if (bVar1 == 0x43) {
              decoder_local._4_4_ = pt_pkt_decode_pip(decoder,packet);
            }
            else if (bVar1 == 0x53) {
              decoder_local._4_4_ = pt_pkt_decode_evd(decoder,packet);
            }
            else {
              if (bVar1 != 0x62) {
                if (bVar1 == 0x73) {
                  iVar3 = pt_pkt_decode_tma(decoder,packet);
                  return iVar3;
                }
                if (bVar1 == 0x82) {
                  iVar3 = pt_pkt_decode_psb(decoder,packet);
                  return iVar3;
                }
                if (bVar1 == 0x83) {
                  iVar3 = pt_pkt_decode_stop(decoder,packet);
                  return iVar3;
                }
                if (bVar1 == 0xa2) {
                  iVar3 = pt_pkt_decode_pwrx(decoder,packet);
                  return iVar3;
                }
                if (bVar1 == 0xa3) {
                  iVar3 = pt_pkt_decode_tnt_64(decoder,packet);
                  return iVar3;
                }
                if (bVar1 == 0xc2) {
                  iVar3 = pt_pkt_decode_mwait(decoder,packet);
                  return iVar3;
                }
                if (bVar1 == 0xc3) {
                  if (pbVar2 <= pbVar5 + 2) {
                    return -7;
                  }
                  if (pbVar5[2] != 0x88) {
                    iVar3 = pt_pkt_decode_unknown(decoder,packet);
                    return iVar3;
                  }
                  iVar3 = pt_pkt_decode_mnt(decoder,packet);
                  return iVar3;
                }
                if (bVar1 == 200) {
                  iVar3 = pt_pkt_decode_vmcs(decoder,packet);
                  return iVar3;
                }
                if (bVar1 != 0xe2) {
                  if (bVar1 == 0xf3) {
                    iVar3 = pt_pkt_decode_ovf(decoder,packet);
                    return iVar3;
                  }
                  if ((bVar1 & 0x1f) == 0x12) {
                    iVar3 = pt_pkt_decode_ptw(decoder,packet);
                    return iVar3;
                  }
                  iVar3 = pt_pkt_decode_unknown(decoder,packet);
                  return iVar3;
                }
              }
              decoder_local._4_4_ = pt_pkt_decode_exstop(decoder,packet);
            }
          }
          else {
            decoder_local._4_4_ = -7;
          }
        }
        else if (bVar1 == 0x19) {
          decoder_local._4_4_ = pt_pkt_decode_tsc(decoder,packet);
        }
        else if (bVar1 == 0x59) {
          decoder_local._4_4_ = pt_pkt_decode_mtc(decoder,packet);
        }
        else if (bVar1 == 0x99) {
          decoder_local._4_4_ = pt_pkt_decode_mode(decoder,packet);
        }
        else if ((bVar1 & 3) == 3) {
          decoder_local._4_4_ = pt_pkt_decode_cyc(decoder,packet);
        }
        else if ((bVar1 & 1) == 0) {
          decoder_local._4_4_ = pt_pkt_decode_tnt_8(decoder,packet);
        }
        else if ((bVar1 & 0x1f) == 0x1d) {
          decoder_local._4_4_ = pt_pkt_decode_fup(decoder,packet);
        }
        else if ((bVar1 & 0x1f) == 0xd) {
          decoder_local._4_4_ = pt_pkt_decode_tip(decoder,packet);
        }
        else if ((bVar1 & 0x1f) == 0x11) {
          decoder_local._4_4_ = pt_pkt_decode_tip_pge(decoder,packet);
        }
        else if ((bVar1 & 0x1f) == 1) {
          decoder_local._4_4_ = pt_pkt_decode_tip_pgd(decoder,packet);
        }
        else {
          decoder_local._4_4_ = pt_pkt_decode_unknown(decoder,packet);
        }
      }
      else {
        decoder_local._4_4_ = -7;
      }
    }
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_pkt_decode(struct pt_packet_decoder *decoder,
			 struct pt_packet *packet)
{
	const struct pt_config *config;
	const uint8_t *pos, *begin, *end;
	uint8_t opc, ext, ext2;

	config = pt_pkt_config(decoder);
	if (!config)
		return -pte_internal;

	begin = config->begin;
	pos = pt_pkt_pos(decoder);
	if (pos < begin)
		return -pte_nosync;

	end = config->end;
	if (end <= pos)
		return -pte_eos;

	opc = *pos++;
	switch (opc) {
	default:
		/* Check opcodes that require masking. */
		if ((opc & pt_opm_cyc) == pt_opc_cyc)
			return pt_pkt_decode_cyc(decoder, packet);

		if ((opc & pt_opm_tnt_8) == pt_opc_tnt_8)
			return pt_pkt_decode_tnt_8(decoder, packet);

		if ((opc & pt_opm_fup) == pt_opc_fup)
			return pt_pkt_decode_fup(decoder, packet);

		if ((opc & pt_opm_tip) == pt_opc_tip)
			return pt_pkt_decode_tip(decoder, packet);

		if ((opc & pt_opm_tip) == pt_opc_tip_pge)
			return pt_pkt_decode_tip_pge(decoder, packet);

		if ((opc & pt_opm_tip) == pt_opc_tip_pgd)
			return pt_pkt_decode_tip_pgd(decoder, packet);

		return pt_pkt_decode_unknown(decoder, packet);

	case pt_opc_mode:
		return pt_pkt_decode_mode(decoder, packet);

	case pt_opc_mtc:
		return pt_pkt_decode_mtc(decoder, packet);

	case pt_opc_tsc:
		return pt_pkt_decode_tsc(decoder, packet);

	case pt_opc_pad:
		return pt_pkt_decode_pad(decoder, packet);

	case pt_opc_ext:
		if (end <= pos)
			return -pte_eos;

		ext = *pos++;
		switch (ext) {
		default:
			/* Check opcodes that require masking. */
			if ((ext & pt_opm_ptw) == pt_ext_ptw)
				return pt_pkt_decode_ptw(decoder, packet);

			return pt_pkt_decode_unknown(decoder, packet);

		case pt_ext_psb:
			return pt_pkt_decode_psb(decoder, packet);

		case pt_ext_ovf:
			return pt_pkt_decode_ovf(decoder, packet);

		case pt_ext_psbend:
			return pt_pkt_decode_psbend(decoder, packet);

		case pt_ext_cbr:
			return pt_pkt_decode_cbr(decoder, packet);

		case pt_ext_tma:
			return pt_pkt_decode_tma(decoder, packet);

		case pt_ext_pip:
			return pt_pkt_decode_pip(decoder, packet);

		case pt_ext_vmcs:
			return pt_pkt_decode_vmcs(decoder, packet);

		case pt_ext_exstop:
		case pt_ext_exstop_ip:
			return pt_pkt_decode_exstop(decoder, packet);

		case pt_ext_mwait:
			return pt_pkt_decode_mwait(decoder, packet);

		case pt_ext_pwre:
			return pt_pkt_decode_pwre(decoder, packet);

		case pt_ext_pwrx:
			return pt_pkt_decode_pwrx(decoder, packet);

		case pt_ext_stop:
			return pt_pkt_decode_stop(decoder, packet);

		case pt_ext_tnt_64:
			return pt_pkt_decode_tnt_64(decoder, packet);

		case pt_ext_cfe:
			return pt_pkt_decode_cfe(decoder, packet);

		case pt_ext_evd:
			return pt_pkt_decode_evd(decoder, packet);

		case pt_ext_ext2:
			if (end <= pos)
				return -pte_eos;

			ext2 = *pos++;
			switch (ext2) {
			default:
				return pt_pkt_decode_unknown(decoder, packet);

			case pt_ext2_mnt:
				return pt_pkt_decode_mnt(decoder, packet);
			}
		}
	}
}